

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O1

JDIMENSION jpeg_skip_scanlines(j_decompress_ptr cinfo,JDIMENSION num_lines)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  jpeg_decomp_master *pjVar4;
  jpeg_d_main_controller *pjVar5;
  jpeg_d_coef_controller *pjVar6;
  jpeg_upsampler *pjVar7;
  jpeg_error_mgr *pjVar8;
  jpeg_d_main_controller *pjVar9;
  long lVar10;
  long lVar11;
  jpeg_entropy_decoder *pjVar12;
  jpeg_d_coef_controller *pjVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  JDIMENSION JVar21;
  jpeg_component_info *pjVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  int M;
  uint local_84;
  uint local_50;
  
  pjVar4 = cinfo->master;
  pjVar5 = cinfo->main;
  pjVar6 = cinfo->coef;
  pjVar7 = cinfo->upsample;
  if ((cinfo->quantize_colors != 0) && (cinfo->two_pass_quantize != 0)) {
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x2f;
    (*pjVar8->error_exit)((j_common_ptr)cinfo);
  }
  iVar25 = cinfo->global_state;
  if (iVar25 != 0xcd) {
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x14;
    (pjVar8->msg_parm).i[0] = iVar25;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar15 = cinfo->output_height;
  uVar26 = cinfo->output_scanline;
  if (uVar15 <= uVar26 + num_lines) {
    cinfo->output_scanline = uVar15;
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    cinfo->inputctl->eoi_reached = 1;
    return uVar15 - uVar26;
  }
  if (num_lines == 0) {
    return 0;
  }
  iVar25 = cinfo->max_v_samp_factor;
  iVar2 = cinfo->min_DCT_scaled_size;
  uVar23 = iVar25 * iVar2;
  uVar17 = (uVar23 - uVar26 % uVar23) % uVar23;
  local_84 = num_lines - uVar17;
  if (cinfo->upsample->need_context_rows == 0) {
    if (num_lines < uVar17) {
      increment_simple_rowgroup_ctr(cinfo,num_lines);
      return num_lines;
    }
    JVar21 = uVar17 + uVar26;
    cinfo->output_scanline = JVar21;
    pjVar5[6].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
    if (*(int *)((long)&pjVar4[1].prepare_for_output_pass + 4) != 0) goto LAB_0011d55e;
    pjVar7[7].need_context_rows = iVar25;
  }
  else {
    if (num_lines < uVar17 + 1) {
LAB_0011d2e9:
      read_and_discard_scanlines(cinfo,num_lines);
      return num_lines;
    }
    if (uVar17 < 2) {
      if (local_84 < uVar23 + 1 && *(int *)&pjVar5[6].start_pass != 0) goto LAB_0011d2e9;
      if (*(int *)&pjVar5[6].start_pass == 0) goto LAB_0011d3bf;
      cinfo->output_scanline = uVar26 + uVar17 + uVar23;
      local_84 = local_84 - uVar23;
    }
    else {
LAB_0011d3bf:
      cinfo->output_scanline = uVar26 + uVar17;
    }
    iVar3 = *(int *)((long)&pjVar5[8].start_pass + 4);
    if (((iVar3 == 0) || (2 < uVar17 && iVar3 == 1)) &&
       (iVar3 = cinfo->num_components, 0 < (long)iVar3)) {
      pjVar22 = cinfo->comp_info;
      pjVar9 = cinfo->main;
      lVar19 = 0;
      do {
        uVar20 = (long)(pjVar22->DCT_scaled_size * pjVar22->v_samp_factor) / (long)iVar2;
        iVar14 = (int)uVar20;
        if (0 < iVar14) {
          lVar10 = *(long *)(pjVar9[6].process_data + lVar19 * 8);
          lVar11 = *(long *)(pjVar9[7].start_pass + lVar19 * 8);
          lVar16 = (long)(iVar14 * (iVar2 + 1));
          uVar20 = uVar20 & 0xffffffff;
          lVar18 = (long)(iVar14 * (iVar2 + 2));
          lVar24 = 0;
          do {
            *(undefined8 *)(lVar10 + uVar20 * -8 + lVar24) =
                 *(undefined8 *)(lVar10 + lVar16 * 8 + lVar24);
            *(undefined8 *)(lVar11 + uVar20 * -8 + lVar24) =
                 *(undefined8 *)(lVar16 * 8 + lVar11 + lVar24);
            *(undefined8 *)(lVar10 + lVar18 * 8 + lVar24) = *(undefined8 *)(lVar10 + lVar24);
            *(undefined8 *)(lVar18 * 8 + lVar11 + lVar24) = *(undefined8 *)(lVar11 + lVar24);
            lVar24 = lVar24 + 8;
          } while (uVar20 * 8 != lVar24);
        }
        lVar19 = lVar19 + 1;
        pjVar22 = pjVar22 + 1;
      } while (lVar19 != iVar3);
    }
    pjVar5[6].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
    *(undefined4 *)((long)&pjVar5[7].process_data + 4) = 0;
    if (*(int *)((long)&pjVar4[1].prepare_for_output_pass + 4) != 0) goto LAB_0011d55e;
    pjVar7[7].need_context_rows = iVar25;
    JVar21 = cinfo->output_scanline;
  }
  *(uint *)&pjVar7[7].field_0x14 = uVar15 - JVar21;
LAB_0011d55e:
  iVar25 = cinfo->upsample->need_context_rows;
  uVar15 = (local_84 - 1) + (uint)(iVar25 == 0);
  local_50 = uVar15 / uVar23;
  uVar26 = uVar15 - uVar15 % uVar23;
  JVar21 = local_84 - uVar26;
  if (cinfo->inputctl->has_multiple_scans == 0) {
    if (uVar15 != uVar15 % uVar23) {
      uVar15 = 0;
      do {
        if (0 < *(int *)&pjVar6[1].consume_data) {
          iVar25 = 0;
          do {
            if (cinfo->MCUs_per_row != 0) {
              uVar17 = 0;
              do {
                pjVar12 = cinfo->entropy;
                if (pjVar12->insufficient_data == 0) {
                  cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
                }
                (*pjVar12->decode_mcu)(cinfo,(JBLOCKROW *)0x0);
                uVar17 = uVar17 + 1;
              } while (uVar17 < cinfo->MCUs_per_row);
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < *(int *)&pjVar6[1].consume_data);
        }
        uVar17 = cinfo->input_iMCU_row + 1;
        cinfo->input_iMCU_row = uVar17;
        cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
        if (uVar17 < cinfo->total_iMCU_rows) {
          pjVar13 = cinfo->coef;
          if (cinfo->comps_in_scan < 2) {
            if (uVar17 < cinfo->total_iMCU_rows - 1) {
              iVar25 = cinfo->cur_comp_info[0]->v_samp_factor;
            }
            else {
              iVar25 = cinfo->cur_comp_info[0]->last_row_height;
            }
            *(int *)&pjVar13[1].consume_data = iVar25;
          }
          else {
            *(undefined4 *)&pjVar13[1].consume_data = 1;
          }
          pjVar13[1].start_input_pass = (_func_void_j_decompress_ptr *)0x0;
        }
        else {
          (*cinfo->inputctl->finish_input_pass)(cinfo);
        }
        uVar15 = uVar15 + uVar23;
      } while (uVar15 < uVar26);
    }
    cinfo->output_scanline = cinfo->output_scanline + uVar26;
    if (cinfo->upsample->need_context_rows == 0) {
      increment_simple_rowgroup_ctr(cinfo,JVar21);
    }
    else {
      piVar1 = (int *)((long)&pjVar5[8].start_pass + 4);
      *piVar1 = *piVar1 + local_50;
      read_and_discard_scanlines(cinfo,JVar21);
    }
    if (*(int *)((long)&pjVar4[1].prepare_for_output_pass + 4) == 0) {
      *(JDIMENSION *)&pjVar7[7].field_0x14 = cinfo->output_height - cinfo->output_scanline;
    }
  }
  else {
    cinfo->output_scanline = cinfo->output_scanline + uVar26;
    cinfo->output_iMCU_row = cinfo->output_iMCU_row + uVar15 / uVar23;
    if (iVar25 == 0) {
      increment_simple_rowgroup_ctr(cinfo,JVar21);
    }
    else {
      piVar1 = (int *)((long)&pjVar5[8].start_pass + 4);
      *piVar1 = *piVar1 + uVar15 / uVar23;
      read_and_discard_scanlines(cinfo,JVar21);
    }
    if (*(int *)((long)&pjVar4[1].prepare_for_output_pass + 4) == 0) {
      *(JDIMENSION *)&pjVar7[7].field_0x14 = cinfo->output_height - cinfo->output_scanline;
    }
  }
  return num_lines;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_skip_scanlines(j_decompress_ptr cinfo, JDIMENSION num_lines)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  my_master_ptr master = (my_master_ptr)cinfo->master;
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  JDIMENSION i, x;
  int y;
  JDIMENSION lines_per_iMCU_row, lines_left_in_iMCU_row, lines_after_iMCU_row;
  JDIMENSION lines_to_skip, lines_to_read;

  /* Two-pass color quantization is not supported. */
  if (cinfo->quantize_colors && cinfo->two_pass_quantize)
    ERREXIT(cinfo, JERR_NOTIMPL);

  if (cinfo->global_state != DSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Do not skip past the bottom of the image. */
  if (cinfo->output_scanline + num_lines >= cinfo->output_height) {
    num_lines = cinfo->output_height - cinfo->output_scanline;
    cinfo->output_scanline = cinfo->output_height;
    (*cinfo->inputctl->finish_input_pass) (cinfo);
    cinfo->inputctl->eoi_reached = TRUE;
    return num_lines;
  }

  if (num_lines == 0)
    return 0;

  lines_per_iMCU_row = cinfo->_min_DCT_scaled_size * cinfo->max_v_samp_factor;
  lines_left_in_iMCU_row =
    (lines_per_iMCU_row - (cinfo->output_scanline % lines_per_iMCU_row)) %
    lines_per_iMCU_row;
  lines_after_iMCU_row = num_lines - lines_left_in_iMCU_row;

  /* Skip the lines remaining in the current iMCU row.  When upsampling
   * requires context rows, we need the previous and next rows in order to read
   * the current row.  This adds some complexity.
   */
  if (cinfo->upsample->need_context_rows) {
    /* If the skipped lines would not move us past the current iMCU row, we
     * read the lines and ignore them.  There might be a faster way of doing
     * this, but we are facing increasing complexity for diminishing returns.
     * The increasing complexity would be a by-product of meddling with the
     * state machine used to skip context rows.  Near the end of an iMCU row,
     * the next iMCU row may have already been entropy-decoded.  In this unique
     * case, we will read the next iMCU row if we cannot skip past it as well.
     */
    if ((num_lines < lines_left_in_iMCU_row + 1) ||
        (lines_left_in_iMCU_row <= 1 && main_ptr->buffer_full &&
         lines_after_iMCU_row < lines_per_iMCU_row + 1)) {
      read_and_discard_scanlines(cinfo, num_lines);
      return num_lines;
    }

    /* If the next iMCU row has already been entropy-decoded, make sure that
     * we do not skip too far.
     */
    if (lines_left_in_iMCU_row <= 1 && main_ptr->buffer_full) {
      cinfo->output_scanline += lines_left_in_iMCU_row + lines_per_iMCU_row;
      lines_after_iMCU_row -= lines_per_iMCU_row;
    } else {
      cinfo->output_scanline += lines_left_in_iMCU_row;
    }

    /* If we have just completed the first block, adjust the buffer pointers */
    if (main_ptr->iMCU_row_ctr == 0 ||
        (main_ptr->iMCU_row_ctr == 1 && lines_left_in_iMCU_row > 2))
      set_wraparound_pointers(cinfo);
    main_ptr->buffer_full = FALSE;
    main_ptr->rowgroup_ctr = 0;
    main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
    if (!master->using_merged_upsample) {
      upsample->next_row_out = cinfo->max_v_samp_factor;
      upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;
    }
  }

  /* Skipping is much simpler when context rows are not required. */
  else {
    if (num_lines < lines_left_in_iMCU_row) {
      increment_simple_rowgroup_ctr(cinfo, num_lines);
      return num_lines;
    } else {
      cinfo->output_scanline += lines_left_in_iMCU_row;
      main_ptr->buffer_full = FALSE;
      main_ptr->rowgroup_ctr = 0;
      if (!master->using_merged_upsample) {
        upsample->next_row_out = cinfo->max_v_samp_factor;
        upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;
      }
    }
  }

  /* Calculate how many full iMCU rows we can skip. */
  if (cinfo->upsample->need_context_rows)
    lines_to_skip = ((lines_after_iMCU_row - 1) / lines_per_iMCU_row) *
                    lines_per_iMCU_row;
  else
    lines_to_skip = (lines_after_iMCU_row / lines_per_iMCU_row) *
                    lines_per_iMCU_row;
  /* Calculate the number of lines that remain to be skipped after skipping all
   * of the full iMCU rows that we can.  We will not read these lines unless we
   * have to.
   */
  lines_to_read = lines_after_iMCU_row - lines_to_skip;

  /* For images requiring multiple scans (progressive, non-interleaved, etc.),
   * all of the entropy decoding occurs in jpeg_start_decompress(), assuming
   * that the input data source is non-suspending.  This makes skipping easy.
   */
  if (cinfo->inputctl->has_multiple_scans) {
    if (cinfo->upsample->need_context_rows) {
      cinfo->output_scanline += lines_to_skip;
      cinfo->output_iMCU_row += lines_to_skip / lines_per_iMCU_row;
      main_ptr->iMCU_row_ctr += lines_to_skip / lines_per_iMCU_row;
      /* It is complex to properly move to the middle of a context block, so
       * read the remaining lines instead of skipping them.
       */
      read_and_discard_scanlines(cinfo, lines_to_read);
    } else {
      cinfo->output_scanline += lines_to_skip;
      cinfo->output_iMCU_row += lines_to_skip / lines_per_iMCU_row;
      increment_simple_rowgroup_ctr(cinfo, lines_to_read);
    }
    if (!master->using_merged_upsample)
      upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;
    return num_lines;
  }

  /* Skip the iMCU rows that we can safely skip. */
  for (i = 0; i < lines_to_skip; i += lines_per_iMCU_row) {
    for (y = 0; y < coef->MCU_rows_per_iMCU_row; y++) {
      for (x = 0; x < cinfo->MCUs_per_row; x++) {
        /* Calling decode_mcu() with a NULL pointer causes it to discard the
         * decoded coefficients.  This is ~5% faster for large subsets, but
         * it's tough to tell a difference for smaller images.
         */
        if (!cinfo->entropy->insufficient_data)
          cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
        (*cinfo->entropy->decode_mcu) (cinfo, NULL);
      }
    }
    cinfo->input_iMCU_row++;
    cinfo->output_iMCU_row++;
    if (cinfo->input_iMCU_row < cinfo->total_iMCU_rows)
      start_iMCU_row(cinfo);
    else
      (*cinfo->inputctl->finish_input_pass) (cinfo);
  }
  cinfo->output_scanline += lines_to_skip;

  if (cinfo->upsample->need_context_rows) {
    /* Context-based upsampling keeps track of iMCU rows. */
    main_ptr->iMCU_row_ctr += lines_to_skip / lines_per_iMCU_row;

    /* It is complex to properly move to the middle of a context block, so
     * read the remaining lines instead of skipping them.
     */
    read_and_discard_scanlines(cinfo, lines_to_read);
  } else {
    increment_simple_rowgroup_ctr(cinfo, lines_to_read);
  }

  /* Since skipping lines involves skipping the upsampling step, the value of
   * "rows_to_go" will become invalid unless we set it here.  NOTE: This is a
   * bit odd, since "rows_to_go" seems to be redundantly keeping track of
   * output_scanline.
   */
  if (!master->using_merged_upsample)
    upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;

  /* Always skip the requested number of lines. */
  return num_lines;
}